

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device.cpp
# Opt level: O1

void embree::updateEdgeLevelBuffer(ISPCSubdivMesh *mesh,Vec3fa *cam_pos,uint startID,uint endID)

{
  Vec3fa *pVVar1;
  Vec3fa *pVVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  if (startID < endID) {
    uVar5 = (ulong)startID;
    do {
      uVar8 = mesh->verticesPerFace[uVar5];
      uVar6 = (ulong)uVar8;
      if (uVar6 != 0) {
        uVar3 = mesh->face_offsets[uVar5];
        if (uVar8 == 4) {
          lVar7 = 0;
          do {
            uVar8 = (int)lVar7 + uVar3;
            lVar7 = lVar7 + 1;
            pVVar1 = *mesh->positions + mesh->position_indices[uVar8];
            pVVar2 = *mesh->positions + mesh->position_indices[((uint)lVar7 & 3) + uVar3];
            fVar11 = (pVVar2->field_0).m128[0] - (pVVar1->field_0).m128[0];
            fVar12 = (pVVar2->field_0).m128[1] - (pVVar1->field_0).m128[1];
            fVar13 = (pVVar2->field_0).m128[2] - (pVVar1->field_0).m128[2];
            fVar14 = ((pVVar1->field_0).m128[0] + (pVVar2->field_0).m128[0]) * -0.5 +
                     (cam_pos->field_0).m128[0];
            fVar15 = ((pVVar1->field_0).m128[1] + (pVVar2->field_0).m128[1]) * -0.5 +
                     (cam_pos->field_0).m128[1];
            fVar16 = ((pVVar1->field_0).m128[2] + (pVVar2->field_0).m128[2]) * -0.5 +
                     (cam_pos->field_0).m128[2];
            fVar11 = fVar13 * fVar13 + fVar12 * fVar12 + fVar11 * fVar11;
            if (fVar11 < 0.0) {
              fVar11 = sqrtf(fVar11);
            }
            else {
              fVar11 = SQRT(fVar11);
            }
            fVar12 = fVar16 * fVar16 + fVar15 * fVar15 + fVar14 * fVar14;
            if (fVar12 < 0.0) {
              fVar12 = sqrtf(fVar12);
            }
            else {
              fVar12 = SQRT(fVar12);
            }
            fVar11 = ((fVar11 * 0.5) / fVar12) * 64.0;
            if (64.0 <= fVar11) {
              fVar11 = 64.0;
            }
            fVar12 = 4.0;
            if (4.0 <= fVar11) {
              fVar12 = fVar11;
            }
            mesh->subdivlevel[uVar8] = fVar12;
          } while (lVar7 != 4);
        }
        else if (uVar8 == 3) {
          lVar7 = 0;
          do {
            uVar8 = (int)lVar7 + uVar3;
            bVar10 = lVar7 == 2;
            lVar7 = lVar7 + 1;
            iVar4 = (int)lVar7;
            if (bVar10) {
              iVar4 = 0;
            }
            pVVar1 = *mesh->positions + mesh->position_indices[uVar8];
            pVVar2 = *mesh->positions + mesh->position_indices[iVar4 + uVar3];
            fVar11 = (pVVar2->field_0).m128[0] - (pVVar1->field_0).m128[0];
            fVar12 = (pVVar2->field_0).m128[1] - (pVVar1->field_0).m128[1];
            fVar13 = (pVVar2->field_0).m128[2] - (pVVar1->field_0).m128[2];
            fVar14 = ((pVVar1->field_0).m128[0] + (pVVar2->field_0).m128[0]) * -0.5 +
                     (cam_pos->field_0).m128[0];
            fVar15 = ((pVVar1->field_0).m128[1] + (pVVar2->field_0).m128[1]) * -0.5 +
                     (cam_pos->field_0).m128[1];
            fVar16 = ((pVVar1->field_0).m128[2] + (pVVar2->field_0).m128[2]) * -0.5 +
                     (cam_pos->field_0).m128[2];
            fVar11 = fVar13 * fVar13 + fVar12 * fVar12 + fVar11 * fVar11;
            if (fVar11 < 0.0) {
              fVar11 = sqrtf(fVar11);
            }
            else {
              fVar11 = SQRT(fVar11);
            }
            fVar12 = fVar16 * fVar16 + fVar15 * fVar15 + fVar14 * fVar14;
            if (fVar12 < 0.0) {
              fVar12 = sqrtf(fVar12);
            }
            else {
              fVar12 = SQRT(fVar12);
            }
            fVar11 = ((fVar11 * 0.5) / fVar12) * 64.0;
            if (64.0 <= fVar11) {
              fVar11 = 64.0;
            }
            fVar12 = 4.0;
            if (4.0 <= fVar11) {
              fVar12 = fVar11;
            }
            mesh->subdivlevel[uVar8] = fVar12;
          } while (lVar7 != 3);
        }
        else {
          uVar9 = 0;
          do {
            uVar8 = (int)uVar9 + uVar3;
            bVar10 = uVar6 - 1 == uVar9;
            uVar9 = uVar9 + 1;
            iVar4 = (int)uVar9;
            if (bVar10) {
              iVar4 = 0;
            }
            pVVar1 = *mesh->positions + mesh->position_indices[uVar8];
            pVVar2 = *mesh->positions + mesh->position_indices[iVar4 + uVar3];
            fVar11 = (pVVar2->field_0).m128[0] - (pVVar1->field_0).m128[0];
            fVar12 = (pVVar2->field_0).m128[1] - (pVVar1->field_0).m128[1];
            fVar13 = (pVVar2->field_0).m128[2] - (pVVar1->field_0).m128[2];
            fVar14 = ((pVVar1->field_0).m128[0] + (pVVar2->field_0).m128[0]) * -0.5 +
                     (cam_pos->field_0).m128[0];
            fVar15 = ((pVVar1->field_0).m128[1] + (pVVar2->field_0).m128[1]) * -0.5 +
                     (cam_pos->field_0).m128[1];
            fVar16 = ((pVVar1->field_0).m128[2] + (pVVar2->field_0).m128[2]) * -0.5 +
                     (cam_pos->field_0).m128[2];
            fVar11 = fVar13 * fVar13 + fVar12 * fVar12 + fVar11 * fVar11;
            if (fVar11 < 0.0) {
              fVar11 = sqrtf(fVar11);
            }
            else {
              fVar11 = SQRT(fVar11);
            }
            fVar12 = fVar16 * fVar16 + fVar15 * fVar15 + fVar14 * fVar14;
            if (fVar12 < 0.0) {
              fVar12 = sqrtf(fVar12);
            }
            else {
              fVar12 = SQRT(fVar12);
            }
            fVar11 = ((fVar11 * 0.5) / fVar12) * 64.0;
            if (64.0 <= fVar11) {
              fVar11 = 64.0;
            }
            fVar12 = 4.0;
            if (4.0 <= fVar11) {
              fVar12 = fVar11;
            }
            mesh->subdivlevel[uVar8] = fVar12;
          } while (uVar6 != uVar9);
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != endID);
  }
  return;
}

Assistant:

void updateEdgeLevelBuffer( ISPCSubdivMesh* mesh, const Vec3fa& cam_pos, unsigned int startID, unsigned int endID )
{
  for (unsigned int f=startID; f<endID;f++) {
    unsigned int e = mesh->face_offsets[f];
    unsigned int N = mesh->verticesPerFace[f];
    if (N == 4) /* fast path for quads */
      for (unsigned int i=0; i<4; i++)
        mesh->subdivlevel[e+i] =  updateEdgeLevel(mesh,cam_pos,e+(i+0),e+(i+1)%4);
    else if (N == 3) /* fast path for triangles */
      for (unsigned int i=0; i<3; i++)
        mesh->subdivlevel[e+i] =  updateEdgeLevel(mesh,cam_pos,e+(i+0),e+(i+1)%3);
    else /* fast path for general polygons */
      for (unsigned int i=0; i<N; i++)
        mesh->subdivlevel[e+i] =  updateEdgeLevel(mesh,cam_pos,e+(i+0),e+(i+1)%N);
  }
}